

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O3

void __thiscall GraphTest_SimpleSquare_Test::TestBody(GraphTest_SimpleSquare_Test *this)

{
  graph lat;
  graph gStack_58;
  
  lattice::graph::simple(&gStack_58,2,4);
  lattice::graph::print(&gStack_58,(ostream *)&std::cout);
  check(&gStack_58);
  if (gStack_58.bonds_.
      super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(gStack_58.bonds_.
                    super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)gStack_58.bonds_.
                          super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)gStack_58.bonds_.
                          super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~vector(&gStack_58.coordinates_);
  std::vector<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>::~vector
            (&gStack_58.sites_);
  return;
}

Assistant:

TEST(GraphTest, SimpleSquare) {
  graph lat = graph::simple(2, 4);
  lat.print(std::cout);
  check(lat);
}